

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O0

FString __thiscall level_info_t::LookupLevelName(level_info_t *this)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  long in_RSI;
  char local_48 [8];
  char checkstring [32];
  char *lookedup;
  char *thename;
  level_info_t *this_local;
  
  if ((*(uint *)(in_RSI + 100) & 0x4000000) == 0) {
    FString::FString((FString *)this,(FString *)(in_RSI + 0x78));
  }
  else {
    pcVar2 = FString::operator_cast_to_char_((FString *)(in_RSI + 0x78));
    checkstring._24_8_ = FStringTable::operator[](&GStrings,pcVar2);
    if ((char *)checkstring._24_8_ == (char *)0x0) {
      lookedup = FString::operator_cast_to_char_((FString *)(in_RSI + 0x78));
    }
    else {
      sVar3 = FString::Len((FString *)(in_RSI + 8));
      if (((sVar3 < 4) || (pcVar2 = FString::operator[]((FString *)(in_RSI + 8),0), *pcVar2 != 'E'))
         || (pcVar2 = FString::operator[]((FString *)(in_RSI + 8),2), *pcVar2 != 'M')) {
        sVar3 = FString::Len((FString *)(in_RSI + 8));
        if (((sVar3 < 4) ||
            (pcVar2 = FString::operator[]((FString *)(in_RSI + 8),0), *pcVar2 != 'M')) ||
           ((pcVar2 = FString::operator[]((FString *)(in_RSI + 8),1), *pcVar2 != 'A' ||
            (pcVar2 = FString::operator[]((FString *)(in_RSI + 8),2), *pcVar2 != 'P')))) {
          sVar3 = FString::Len((FString *)(in_RSI + 8));
          if (((sVar3 < 6) ||
              (pcVar2 = FString::operator[]((FString *)(in_RSI + 8),0), *pcVar2 != 'L')) ||
             ((pcVar2 = FString::operator[]((FString *)(in_RSI + 8),1), *pcVar2 != 'E' ||
              (((pcVar2 = FString::operator[]((FString *)(in_RSI + 8),2), *pcVar2 != 'V' ||
                (pcVar2 = FString::operator[]((FString *)(in_RSI + 8),3), *pcVar2 != 'E')) ||
               (pcVar2 = FString::operator[]((FString *)(in_RSI + 8),4), *pcVar2 != 'L')))))) {
            local_48[0] = '\0';
          }
          else {
            pcVar2 = FString::operator[]((FString *)(in_RSI + 8),5);
            uVar1 = atoi(pcVar2);
            mysnprintf(local_48,0x20,"%d: ",(ulong)uVar1);
          }
        }
        else {
          pcVar2 = FString::operator[]((FString *)(in_RSI + 8),3);
          uVar1 = atoi(pcVar2);
          mysnprintf(local_48,0x20,"%d: ",(ulong)uVar1);
        }
      }
      else {
        pcVar2 = FString::GetChars((FString *)(in_RSI + 8));
        mysnprintf(local_48,0x20,"%s: ",pcVar2);
      }
      pcVar2 = strstr((char *)checkstring._24_8_,local_48);
      if (pcVar2 == (char *)0x0) {
        lookedup = (char *)checkstring._24_8_;
      }
      else {
        sVar4 = strlen(local_48);
        lookedup = pcVar2 + sVar4;
      }
    }
    FString::FString((FString *)this,lookedup);
  }
  return (FString)(char *)this;
}

Assistant:

FString level_info_t::LookupLevelName()
{
	if (flags & LEVEL_LOOKUPLEVELNAME)
	{
		const char *thename;
		const char *lookedup;

		lookedup = GStrings[LevelName];
		if (lookedup == NULL)
		{
			thename = LevelName;
		}
		else
		{
			char checkstring[32];

			// Strip out the header from the localized string
			if (MapName.Len() > 3 && MapName[0] == 'E' && MapName[2] == 'M')
			{
				mysnprintf (checkstring, countof(checkstring), "%s: ", MapName.GetChars());
			}
			else if (MapName.Len() > 3 && MapName[0] == 'M' && MapName[1] == 'A' && MapName[2] == 'P')
			{
				mysnprintf (checkstring, countof(checkstring), "%d: ", atoi(&MapName[3]));
			}
			else if (MapName.Len() > 5 && MapName[0] == 'L' && MapName[1] == 'E' && MapName[2] == 'V' && MapName[3] == 'E' && MapName[4] == 'L')
			{
				mysnprintf (checkstring, countof(checkstring), "%d: ", atoi(&MapName[5]));
			}
			else
			{
				// make sure nothing is stripped.
				checkstring[0] = '\0';
			}
			thename = strstr (lookedup, checkstring);
			if (thename == NULL)
			{
				thename = lookedup;
			}
			else
			{
				thename += strlen (checkstring);
			}
		}
		return thename;
	}
	else return LevelName;
}